

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

int helicsInputGetOption(HelicsInput inp,int option)

{
  int iVar1;
  HelicsInput pvVar2;
  
  iVar1 = 0;
  pvVar2 = (HelicsInput)0x0;
  if ((inp != (HelicsInput)0x0) && (*inp == 0x3456e052)) {
    pvVar2 = inp;
  }
  if (pvVar2 != (HelicsInput)0x0) {
    iVar1 = (**(code **)(**(long **)((long)pvVar2 + 0x18) + 0x18))();
  }
  return iVar1;
}

Assistant:

int helicsInputGetOption(HelicsInput inp, int option)
{
    auto* inpObj = verifyInput(inp, nullptr);
    if (inpObj == nullptr) {
        return HELICS_FALSE;
    }
    try {
        return (inpObj->inputPtr->getOption(option));
    }
    // LCOV_EXCL_START
    catch (...) {
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}